

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

int Parser_UTF8ToInt(char *ss,ptrdiff_t *len)

{
  uint uVar1;
  
  uVar1 = (uint)(byte)*ss;
  if (*ss < '\0') {
    uVar1 = (uint)(char)(-(g_error_char == '\0') | g_error_char);
    *len = (ulong)(g_error_char != '\0');
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,0x342,"Parser_UTF8ToInt","Error %d\n",(ulong)uVar1);
  }
  else {
    *len = 1;
  }
  return uVar1;
}

Assistant:

static int Parser_UTF8ToInt(
	/*! [in] The pointer to the character to encode. */
	const char *ss,
	/*! [out] The number of octets of the UTF-8 encoding of this character.
	 */
	ptrdiff_t *len)
{
	const unsigned char *s = (const unsigned char *)ss;
	int c = *s;

	if (c <= 127) {
		/* if c<=127, c is just the character. */
		*len = 1;
		return c;
	} else if ((c & 0xE0) == 0xC0 && (s[1] & 0xc0) == 0x80) {
		/* a sequence of 110xxxxx and 10xxxxxx? */
		*len = 2;
		return ((c & 0x1f) << 6) | (s[1] & 0x3f);
	} else if ((c & 0xF0) == 0xE0 && (s[1] & 0xc0) == 0x80 &&
		   (s[2] & 0xc0) == 0x80) {
		/* a sequence of 1110xxxx,10xxxxxx and 10xxxxxx ? */
		*len = 3;
		return ((c & 0x0f) << 12) | ((s[1] & 0x3f) << 6) |
		       (s[2] & 0x3f);
	} else if ((c & 0xf8) == 0xf0 && (s[1] & 0xc0) == 0x80 &&
		   (s[2] & 0xc0) == 0x80 && (s[3] & 0xc0) == 0x80) {
		/* a sequence of 11110xxx,10xxxxxx,10xxxxxx and 10xxxxxx ? */
		*len = 4;
		return ((c & 0x07) << 18) | ((s[1] & 0x3f) << 12) |
		       ((s[2] & 0x3f) << 6) | (s[3] & 0x3f);
	} else if ((c & 0xfc) == 0xf8 && (s[1] & 0xc0) == 0x80 &&
		   (s[2] & 0xc0) == 0x80 && (s[3] & 0xc0) == 0x80 &&
		   (s[4] & 0xc0) == 0x80) {
		/* a sequence of 111110xx,10xxxxxx,10xxxxxx,10xxxxxx,10xxxxxx ?
		 */
		*len = 5;
		return ((c & 0x03) << 24) | ((s[1] & 0x3f) << 18) |
		       ((s[2] & 0x3f) << 12) | ((s[3] & 0x3f) << 6) |
		       (s[4] & 0x3f);
	} else if ((c & 0xfe) == 0xfc && (s[1] & 0xc0) == 0x80 &&
		   (s[2] & 0xc0) == 0x80 && (s[3] & 0xc0) == 0x80 &&
		   (s[4] & 0xc0) == 0x80 && (s[5] & 0xc0) == 0x80) {
		/* a sequence of 1111110x,10xxxxxx,10xxxxxx,10xxxxxx,10xxxxxx
		 * and 10xxxxxx ? */
		*len = 6;
		return ((c & 0x01) << 30) | ((s[1] & 0x3f) << 24) |
		       ((s[2] & 0x3f) << 18) | ((s[3] & 0x3f) << 12) |
		       ((s[4] & 0x3f) << 6) | (s[5] & 0x3f);
	} else {
		/* none of above, error */
		int ret = 0;
		int line = __LINE__;
		if (g_error_char) {
			*len = 1;
			ret = g_error_char;
		} else {
			*len = 0;
			ret = -1;
		}
		IxmlPrintf(
			__FILE__, line, "Parser_UTF8ToInt", "Error %d\n", ret);
		return ret;
	}
}